

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableExpression.hpp
# Opt level: O0

string * Kandinsky::VariableExpression::generateName_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_48 [32];
  string local_28 [4];
  int in_stack_ffffffffffffffdc;
  
  generateName::count = generateName::count + 1;
  __lhs = in_RDI;
  std::__cxx11::to_string(in_stack_ffffffffffffffdc);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::~string(local_48);
  return __lhs;
}

Assistant:

static std::string generateName()
        {
            static int count(0);
            return "x_{" + std::to_string(count++) + "}";
        }